

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::WasmBytecodeGenerator::EmitBrTable(WasmBytecodeGenerator *this)

{
  uint uVar1;
  bool bVar2;
  WasmReaderBase *pWVar3;
  BlockInfo *this_00;
  BlockInfo *other;
  WasmCompilationException *this_01;
  PolymorphicEmitInfo PVar4;
  PolymorphicEmitInfo polyExpr;
  PolymorphicEmitInfo polyExpr_00;
  BlockInfo *blockInfo;
  uint32 target;
  uint32 i;
  BlockInfo *defaultBlockInfo;
  PolymorphicEmitInfo yieldValue;
  EmitInfo local_58;
  PolymorphicEmitInfo local_50;
  PolymorphicEmitInfo local_40;
  EmitInfo local_2c;
  EmitInfo scrutineeInfo;
  uint32 defaultEntry;
  uint32 *targetTable;
  uint32 numTargets;
  WasmBytecodeGenerator *this_local;
  
  pWVar3 = GetReader(this);
  uVar1 = (pWVar3->m_currentNode).field_1.brTable.numTargets;
  pWVar3 = GetReader(this);
  unique0x00012000 = (pWVar3->m_currentNode).field_1.brTable.targetTable;
  pWVar3 = GetReader(this);
  scrutineeInfo.super_EmitInfoBase.location = (pWVar3->m_currentNode).field_1.brTable.defaultTarget;
  yieldValue.field_1.singleInfo.type = FirstLocalType;
  EmitInfo::EmitInfo(&local_58,&yieldValue.field_1.singleInfo.type);
  PolymorphicEmitInfo::PolymorphicEmitInfo(&local_50,local_58);
  PVar4._4_4_ = 0;
  PVar4.count = local_50.count;
  PVar4.field_1.singleInfo = local_50.field_1.singleInfo;
  PVar4 = PopStackPolymorphic(this,PVar4,L"br_table expression must be of type i32");
  local_40.field_1 = PVar4.field_1;
  local_40.count = PVar4.count;
  local_2c = PolymorphicEmitInfo::GetInfo(&local_40,0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,0x29,(ulong)local_2c & 0xffffffff,(ulong)local_2c & 0xffffffff);
  PolymorphicEmitInfo::PolymorphicEmitInfo((PolymorphicEmitInfo *)&defaultBlockInfo);
  this_00 = GetBlockInfo(this,scrutineeInfo.super_EmitInfoBase.location);
  bVar2 = BlockInfo::HasYield(this_00);
  if (bVar2) {
    PVar4 = PopStackPolymorphic(this,this_00,(char16 *)0x0);
    yieldValue._0_8_ = PVar4.field_1;
    defaultBlockInfo = (BlockInfo *)CONCAT44(i,PVar4.count);
  }
  blockInfo._4_4_ = 0;
  while( true ) {
    if (uVar1 <= blockInfo._4_4_) {
      polyExpr_00._0_8_ = (ulong)defaultBlockInfo & 0xffffffff;
      polyExpr_00.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)yieldValue._0_8_;
      YieldToBlock(this,this_00,polyExpr_00);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
                (this->m_writer,(ulong)(uint)this_00->label,0x2a);
      ReleaseLocation(this,&local_2c);
      ReleaseLocation(this,(PolymorphicEmitInfo *)&defaultBlockInfo);
      SetUnreachableState(this,true);
      return;
    }
    other = GetBlockInfo(this,stack0xffffffffffffffe0[blockInfo._4_4_]);
    bVar2 = BlockInfo::IsEquivalent(this_00,other);
    if (!bVar2) break;
    polyExpr._0_8_ = (ulong)defaultBlockInfo & 0xffffffff;
    polyExpr.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)yieldValue._0_8_;
    YieldToBlock(this,other,polyExpr);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1b])
              (this->m_writer,0x2c,(ulong)(uint)other->label,(ulong)local_2c & 0xffffffff,
               (ulong)blockInfo._4_4_);
    blockInfo._4_4_ = blockInfo._4_4_ + 1;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"br_table target %u signature mismatch");
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmBytecodeGenerator::EmitBrTable()
{
    const uint32 numTargets = GetReader()->m_currentNode.brTable.numTargets;
    const uint32* targetTable = GetReader()->m_currentNode.brTable.targetTable;
    const uint32 defaultEntry = GetReader()->m_currentNode.brTable.defaultTarget;

    // Compile scrutinee
    EmitInfo scrutineeInfo = PopStackPolymorphic(EmitInfo(WasmTypes::I32), _u("br_table expression must be of type i32")).GetInfo(0);

    m_writer->AsmReg2(Js::OpCodeAsmJs::BeginSwitch_Int, scrutineeInfo.location, scrutineeInfo.location);
    PolymorphicEmitInfo yieldValue;
    BlockInfo* defaultBlockInfo = GetBlockInfo(defaultEntry);
    if (defaultBlockInfo->HasYield())
    {
        yieldValue = PopStackPolymorphic(defaultBlockInfo);
    }

    // Compile cases
    for (uint32 i = 0; i < numTargets; i++)
    {
        uint32 target = targetTable[i];
        BlockInfo* blockInfo = GetBlockInfo(target);
        if (!defaultBlockInfo->IsEquivalent(blockInfo))
        {
            throw WasmCompilationException(_u("br_table target %u signature mismatch"));
        }
        YieldToBlock(blockInfo, yieldValue);
        m_writer->AsmBrReg1Const1(Js::OpCodeAsmJs::Case_IntConst, blockInfo->label, scrutineeInfo.location, i);
    }

    YieldToBlock(defaultBlockInfo, yieldValue);
    m_writer->AsmBr(defaultBlockInfo->label, Js::OpCodeAsmJs::EndSwitch_Int);
    ReleaseLocation(&scrutineeInfo);
    ReleaseLocation(&yieldValue);

    SetUnreachableState(true);
}